

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void print_list_aux(List *ls,int indent,FILE *out)

{
  ListStruct **ppLVar1;
  int iVar2;
  ListStruct *pLVar3;
  char *__s;
  int iVar4;
  bool bVar5;
  char buf [256];
  
  iVar2 = 0;
  if (0 < indent) {
    iVar2 = indent;
  }
  bVar5 = true;
  do {
    if (ls == (List *)0x0) {
      return;
    }
    if (!bVar5) {
      putc(0x20,(FILE *)out);
    }
    if ((ls->token).type == TOK_LIST) {
      ppLVar1 = &ls->car;
      pLVar3 = (ListStruct *)ppLVar1;
      do {
        pLVar3 = pLVar3->cdr;
        if (pLVar3 == (ListStruct *)0x0) {
          putc(0x28,(FILE *)out);
          print_list_aux(*ppLVar1,indent,out);
          goto LAB_001076a7;
        }
      } while ((pLVar3->token).type != TOK_LIST);
      putc(10,(FILE *)out);
      iVar4 = iVar2;
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        putc(0x20,(FILE *)out);
      }
      putc(0x28,(FILE *)out);
      print_list_aux(*ppLVar1,indent + 2,out);
LAB_001076a7:
      putc(0x29,(FILE *)out);
    }
    else {
      __s = unparse_token(&ls->token,buf);
      fputs(__s,(FILE *)out);
    }
    ls = ls->cdr;
    bVar5 = false;
  } while( true );
}

Assistant:

static void
print_list_aux (const List *ls, int indent, FILE *out)
{
  BOOL print_space = FALSE;
  int i;
  char buf[256];
  const List *l2;

  for (; ls != NULL; ls = ls->cdr)
    {
      /* Print a space before each token but the first. */
      if (print_space) putc (' ', out);
      else print_space = TRUE;

      /* Print lists recursively. */
      if (ls->token.type == TOK_LIST)
	{
	  /* If it has sublists, or it's a sequence, put it down on another
           * line and indent it.
	   */
	  for (l2 = ls->car; l2 != NULL; l2 = l2->cdr)
	    if (l2->token.type == TOK_LIST)
	      break;
	  if (l2 != NULL)
	    {
	      putc ('\n', out);
	      for (i = 0; i < indent; i++)
		putc (' ', out);
	      putc ('(', out);
	      print_list_aux (ls->car, indent + 2, out);
	      putc (')', out);
	    }
	  else    /* No sublists? */
	    {
	      putc ('(', out);
	      print_list_aux (ls->car, indent, out);
	      putc (')', out);
	    }
	}
      else fputs (unparse_token (&ls->token, buf), out);
    }
}